

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-stack-opts.cpp
# Opt level: O2

void __thiscall wasm::StackIROptimizer::vacuum(StackIROptimizer *this)

{
  pointer ppSVar1;
  uint uVar2;
  ulong uVar3;
  
  uVar2 = 0;
  while( true ) {
    uVar3 = (ulong)uVar2;
    ppSVar1 = (this->insts->
              super__Vector_base<wasm::StackInst_*,_std::allocator<wasm::StackInst_*>_>)._M_impl.
              super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->insts->
                      super__Vector_base<wasm::StackInst_*,_std::allocator<wasm::StackInst_*>_>).
                      _M_impl.super__Vector_impl_data._M_finish - (long)ppSVar1 >> 3) <= uVar3)
    break;
    if ((ppSVar1[uVar3] != (StackInst *)0x0) && (ppSVar1[uVar3]->origin->_id == NopId)) {
      ppSVar1[uVar3] = (StackInst *)0x0;
    }
    uVar2 = uVar2 + 1;
  }
  return;
}

Assistant:

void StackIROptimizer::vacuum() {
  // In the wasm binary format a nop is never needed. (In Binaryen IR, in
  // comparison, it is necessary e.g. in a function body or an if arm.)
  //
  // It is especially important to remove nops because we add nops when we
  // read wasm into Binaryen IR. That is, this avoids a potential increase in
  // code size.
  for (Index i = 0; i < insts.size(); i++) {
    auto*& inst = insts[i];
    if (inst && inst->origin->is<Nop>()) {
      inst = nullptr;
    }
  }
}